

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCreator_AM.h
# Opt level: O2

BGIP_SolverAlternatingMaximization<JointPolicyPureVector> * __thiscall
BGIP_SolverCreator_AM<JointPolicyPureVector>::operator()
          (BGIP_SolverCreator_AM<JointPolicyPureVector> *this,
          shared_ptr<const_BayesianGameIdenticalPayoffInterface> *bg)

{
  ostream *poVar1;
  BGIP_SolverAlternatingMaximization<JointPolicyPureVector> *this_00;
  int verbose;
  
  verbose = this->_m_verbose;
  if (1 < verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "BGIP_SolverCreator_AM:: creating a new BGIP_SolverAlternatingMaximization with nrRestarts="
                            );
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,", verbose=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_m_verbose);
    poVar1 = std::operator<<(poVar1,", nrSols=");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    verbose = this->_m_verbose;
  }
  this_00 = (BGIP_SolverAlternatingMaximization<JointPolicyPureVector> *)operator_new(0x128);
  BGIP_SolverAlternatingMaximization<JointPolicyPureVector>::BGIP_SolverAlternatingMaximization
            (this_00,bg,(uint)this->_m_nrRestarts,verbose,this->_m_nrSolutions);
  (**(code **)(*(long *)&(this_00->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                         super_BGIP_IncrementalSolverInterface + 0x30))
            (this->_m_deadlineInSeconds,this_00);
  return this_00;
}

Assistant:

BGIP_SolverAlternatingMaximization<JP>* operator()
        (const boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> &bg) const
        {
            if(_m_verbose >= 2)
            {
                std::cout << "BGIP_SolverCreator_AM:: creating a new BGIP_SolverAlternatingMaximization with nrRestarts=" << _m_nrRestarts<< ", verbose=" << _m_verbose << ", nrSols="<<_m_nrSolutions << std::endl;
            }
            BGIP_SolverAlternatingMaximization<JP>* bgsolver=
                new BGIP_SolverAlternatingMaximization<JP>(
                    bg,
                    _m_nrRestarts,
                    _m_verbose,
                    _m_nrSolutions);
            bgsolver->SetDeadline(_m_deadlineInSeconds);
            return(bgsolver);
        }